

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

RTCScene rtcNewScene(RTCDevice hdevice)

{
  int iVar1;
  Scene *this;
  undefined4 extraout_var;
  undefined8 *puVar2;
  allocator local_49;
  DeviceEnterLeave enterleave;
  
  if (hdevice != (RTCDevice)0x0) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hdevice);
    this = (Scene *)embree::Accel::operator_new(0x350);
    embree::Scene::Scene(this,(Device *)hdevice);
    iVar1 = (*(this->super_AccelN).super_Accel.super_AccelData.super_RefCount._vptr_RefCount[2])
                      (this);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
    return (RTCScene)CONCAT44(extraout_var,iVar1);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&enterleave,"invalid argument",&local_49);
  *puVar2 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar2 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&enterleave);
  __cxa_throw(puVar2,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API RTCScene rtcNewScene (RTCDevice hdevice) 
  {
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcNewScene);
    RTC_VERIFY_HANDLE(hdevice);
    RTC_ENTER_DEVICE(hdevice);
    Scene* scene = new Scene((Device*)hdevice);
    return (RTCScene) scene->refInc();
    RTC_CATCH_END((Device*)hdevice);
    return nullptr;
  }